

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

void __thiscall
QNetworkReplyHttpImplPrivate::error
          (QNetworkReplyHttpImplPrivate *this,NetworkError code,QString *errorMessage)

{
  NetworkError NVar1;
  QNetworkReply *this_00;
  
  NVar1 = (this->super_QNetworkReplyPrivate).errorCode;
  if (NVar1 != NoError) {
    if (NVar1 != OperationCanceledError) {
      error();
    }
    return;
  }
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  (this->super_QNetworkReplyPrivate).errorCode = code;
  QIODevice::setErrorString((QString *)this_00);
  QNetworkReply::errorOccurred(this_00,code);
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::error(QNetworkReplyImpl::NetworkError code, const QString &errorMessage)
{
    Q_Q(QNetworkReplyHttpImpl);
    // Can't set and emit multiple errors.
    if (errorCode != QNetworkReply::NoError) {
        // But somewhat unavoidable if we have cancelled the request:
        if (errorCode != QNetworkReply::OperationCanceledError)
            qWarning("QNetworkReplyImplPrivate::error: Internal problem, this method must only be called once.");
        return;
    }

    errorCode = code;
    q->setErrorString(errorMessage);

    // note: might not be a good idea, since users could decide to delete us
    // which would delete the backend too...
    // maybe we should protect the backend
    emit q->errorOccurred(code);
}